

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_IntSortCostReverse(Gia_Man_t *pNew,int *pArray,int nSize)

{
  ulong uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  if (1 < nSize) {
    uVar6 = 1;
    uVar5 = 0;
    do {
      uVar1 = uVar5 + 1;
      uVar8 = uVar5 & 0xffffffff;
      uVar7 = uVar6;
      do {
        if (pArray[uVar7] < 0) {
LAB_008a59a8:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar9 = (uint)pArray[uVar7] >> 1;
        pVVar3 = pNew->vLevels;
        Vec_IntFillExtra(pVVar3,uVar9 + 1,0);
        if (pVVar3->nSize <= (int)uVar9) {
LAB_008a5989:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (pArray[(int)(uint)uVar8] < 0) goto LAB_008a59a8;
        iVar2 = pVVar3->pArray[uVar9];
        uVar9 = (uint)pArray[(int)(uint)uVar8] >> 1;
        pVVar3 = pNew->vLevels;
        Vec_IntFillExtra(pVVar3,uVar9 + 1,0);
        if (pVVar3->nSize <= (int)uVar9) goto LAB_008a5989;
        uVar4 = (uint)uVar7;
        if (iVar2 <= pVVar3->pArray[uVar9]) {
          uVar4 = (uint)uVar8;
        }
        uVar7 = uVar7 + 1;
        uVar8 = (ulong)uVar4;
      } while ((uint)nSize != uVar7);
      iVar2 = pArray[uVar5];
      pArray[uVar5] = pArray[(int)uVar4];
      pArray[(int)uVar4] = iVar2;
      uVar6 = uVar6 + 1;
      uVar5 = uVar1;
    } while (uVar1 != nSize - 1);
  }
  return;
}

Assistant:

void Wlc_IntSortCostReverse( Gia_Man_t * pNew, int * pArray, int nSize )
{
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( Gia_ObjLevelId(pNew, Abc_Lit2Var(pArray[j])) > Gia_ObjLevelId(pNew, Abc_Lit2Var(pArray[best_i])) )
                best_i = j;
        ABC_SWAP( int, pArray[i], pArray[best_i] );
    }
}